

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GameEngine.cpp
# Opt level: O0

void __thiscall GameEngine::generateMap(GameEngine *this)

{
  RandomGenerator *pRVar1;
  Config *pCVar2;
  element_type *this_00;
  shared_ptr<Map> local_38;
  pair<int,_int> local_28;
  int32_t local_20;
  pair<int,_int> pStack_1c;
  int32_t width;
  int32_t local_14;
  GameEngine *pGStack_10;
  int32_t height;
  GameEngine *this_local;
  
  pGStack_10 = this;
  pRVar1 = RandomGenerator::getInstance();
  pCVar2 = Config::getInstance();
  pStack_1c = Config::getHeight(pCVar2);
  local_14 = RandomGenerator::randNormalInt(pRVar1,pStack_1c);
  pRVar1 = RandomGenerator::getInstance();
  pCVar2 = Config::getInstance();
  local_28 = Config::getWidth(pCVar2);
  local_20 = RandomGenerator::randNormalInt(pRVar1,local_28);
  std::make_shared<Map,int&,int&>((int *)&local_38,&local_14);
  std::shared_ptr<Map>::operator=(&this->map,&local_38);
  std::shared_ptr<Map>::~shared_ptr(&local_38);
  this_00 = std::__shared_ptr_access<Map,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                      ((__shared_ptr_access<Map,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)this);
  Map::generate(this_00);
  return;
}

Assistant:

void GameEngine::generateMap() {
  int32_t height = RandomGenerator::getInstance().randNormalInt(Config::getInstance().getHeight());
  int32_t width = RandomGenerator::getInstance().randNormalInt(Config::getInstance().getWidth());

  map = std::make_shared<Map>(height, width);
  map->generate();
}